

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O2

void __thiscall mserialize::cx_string<7UL>::cx_string(cx_string<7UL> *this,char *str)

{
  size_t i;
  long lVar1;
  
  *(undefined8 *)this->_data = 0;
  for (lVar1 = 0; lVar1 != 7; lVar1 = lVar1 + 1) {
    this->_data[lVar1] = str[lVar1];
  }
  return;
}

Assistant:

explicit constexpr cx_string(const char* str)
    :_data{0}
  {
    #if defined(__GNUC__) && !defined(__clang__)
      // https://gcc.gnu.org/bugzilla/show_bug.cgi?id=96742
      #pragma GCC diagnostic push
      #pragma GCC diagnostic ignored "-Wtype-limits"
    #endif
    for (std::size_t i = 0; i < N; ++i)
    {
      _data[i] = str[i];
    }
    #if defined(__GNUC__) && !defined(__clang__)
      #pragma GCC diagnostic pop
    #endif
  }